

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall pstore::broker::command_processor::scavenge(command_processor *this)

{
  bool bVar1;
  pointer ppVar2;
  zstring d;
  double __x;
  undefined1 local_bc [8];
  array<char,_100UL> buffer;
  time_point arrival_time;
  iterator it;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  local_38;
  iterator end;
  lock_guard<std::mutex> lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  earliest_time;
  command_processor *this_local;
  
  pstore::gsl::not_null<const_char_*>::not_null
            ((not_null<const_char_*> *)&earliest_time,"Scavenging zombie commands");
  pstore::log((pstore *)0x6,__x);
  lock._M_device = (mutex_type *)std::chrono::_V2::system_clock::now();
  local_20 = std::chrono::operator-
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&lock,&this->delete_threshold_);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&end,&this->cmds_mut_);
  local_38._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<std::pair<unsigned_long,unsigned_long>,pstore::broker::pieces,std::hash<std::pair<unsigned_long,unsigned_long>>,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>>>
                 (&this->cmds_);
  arrival_time.__d.__r =
       (duration)
       std::
       begin<std::unordered_map<std::pair<unsigned_long,unsigned_long>,pstore::broker::pieces,std::hash<std::pair<unsigned_long,unsigned_long>>,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>>>
                 (&this->cmds_);
  while (bVar1 = std::__detail::operator!=
                           ((_Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                             *)&arrival_time,&local_38), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
                           *)&arrival_time);
    buffer._M_elems._92_8_ = (ppVar2->second).arrive_time_.__d.__r;
    bVar1 = std::chrono::operator<
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)(buffer._M_elems + 0x5c),&local_20);
    if (bVar1) {
      d = anon_unknown.dwarf_7ac11::time_to_string
                    ((time_point)buffer._M_elems._92_8_,(array<char,_100UL> *)local_bc);
      log<char*>(info,"Deleted old partial message. Arrived ",d);
      arrival_time.__d.__r =
           (duration)
           std::
           unordered_map<std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>_>
           ::erase(&this->cmds_,(iterator)arrival_time.__d.__r);
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>
                    *)&arrival_time);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&end);
  return;
}

Assistant:

void command_processor::scavenge () {
            pstore::log (priority::info, "Scavenging zombie commands");

            // After this function is complete, no partial messages older than 'earliest time' will
            // be in the partial command map (cmds_).
            auto const earliest_time = std::chrono::system_clock::now () - delete_threshold_;

            // Remove all partial messages where the last piece of the message arrived before
            // earliest_time. It's most likely that the sending process gave up/crashed/lost
            // interest before sending the complete message.
            std::lock_guard<decltype (cmds_mut_)> const lock{cmds_mut_};
            auto const end = std::end (cmds_);
            auto it = std::begin (cmds_);
            while (it != end) {
                auto const arrival_time = it->second.arrive_time_;
                if (arrival_time < earliest_time) {
                    std::array<char, 100> buffer;
                    pstore::log (priority::info, "Deleted old partial message. Arrived ",
                                 time_to_string (arrival_time, &buffer));
                    it = cmds_.erase (it);
                } else {
                    ++it;
                }
            }
        }